

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  undefined4 *puVar2;
  BVH *bvh;
  size_t sVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  uint uVar20;
  int iVar21;
  AABBNodeMB4D *node1;
  ulong uVar22;
  ulong uVar23;
  undefined4 uVar24;
  ulong uVar25;
  QuadMesh *mesh;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  float *vertices1;
  ulong uVar31;
  ulong uVar32;
  vuint<4> *v;
  long lVar33;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar34;
  size_t sVar35;
  NodeRef root;
  NodeRef *pNVar36;
  bool bVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar54;
  undefined1 auVar50 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar51;
  float fVar52;
  float fVar53;
  undefined1 in_ZMM0 [64];
  float fVar75;
  float fVar77;
  undefined1 auVar55 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar76;
  float fVar78;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar96;
  float fVar102;
  vint4 ai_2;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  vint4 bi_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  float fVar132;
  float fVar133;
  vint4 bi_3;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar134;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  vint4 bi;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar147;
  float fVar154;
  float fVar155;
  vint4 bi_2;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar156;
  undefined1 auVar153 [16];
  float fVar157;
  float fVar162;
  float fVar163;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar164;
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar161;
  undefined1 auVar165 [16];
  float fVar166;
  float fVar169;
  float fVar170;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar171;
  float fVar172;
  float fVar174;
  float fVar175;
  undefined1 auVar173 [16];
  float fVar176;
  float fVar177;
  uint uVar179;
  float fVar180;
  uint uVar181;
  float fVar182;
  undefined1 auVar178 [16];
  uint uVar183;
  float fVar184;
  float fVar185;
  float fVar189;
  float fVar190;
  vint4 ai;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar191;
  float fVar192;
  float fVar197;
  uint uVar198;
  float fVar199;
  vint4 ai_1;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  uint uVar200;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar201;
  float fVar202;
  float fVar209;
  float fVar210;
  vint4 ai_3;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar211;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  vuint<4> *v_1;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  vbool<4> terminated;
  Vec3<embree::vfloat_impl<4>_> p0;
  float local_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float local_1848;
  float fStack_1844;
  float fStack_1840;
  float fStack_183c;
  float local_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar7 = mm_lookupmask_ps._240_16_;
  uVar19 = mm_lookupmask_ps._8_8_;
  uVar18 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar62 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar57 = vpcmpeqd_avx(auVar62,(undefined1  [16])valid_i->field_0);
    auVar55 = ZEXT816(0) << 0x40;
    auVar73 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar55,5);
    auVar124 = auVar57 & auVar73;
    if ((((auVar124 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar124 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar124 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar124[0xf] < '\0'
       ) {
      auVar73 = vandps_avx(auVar73,auVar57);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar167._8_4_ = 0x7fffffff;
      auVar167._0_8_ = 0x7fffffff7fffffff;
      auVar167._12_4_ = 0x7fffffff;
      auVar57 = vandps_avx(auVar167,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar158._8_4_ = 0x219392ef;
      auVar158._0_8_ = 0x219392ef219392ef;
      auVar158._12_4_ = 0x219392ef;
      auVar57 = vcmpps_avx(auVar57,auVar158,1);
      auVar124 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar158,auVar57
                              );
      auVar57 = vandps_avx(auVar167,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar57 = vcmpps_avx(auVar57,auVar158,1);
      auVar125 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar158,auVar57
                              );
      auVar57 = vandps_avx(auVar167,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar57 = vcmpps_avx(auVar57,auVar158,1);
      auVar57 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar158,auVar57)
      ;
      auVar123 = vrcpps_avx(auVar124);
      fVar52 = auVar123._0_4_;
      auVar114._0_4_ = auVar124._0_4_ * fVar52;
      fVar53 = auVar123._4_4_;
      auVar114._4_4_ = auVar124._4_4_ * fVar53;
      fVar54 = auVar123._8_4_;
      auVar114._8_4_ = auVar124._8_4_ * fVar54;
      fVar75 = auVar123._12_4_;
      auVar114._12_4_ = auVar124._12_4_ * fVar75;
      auVar159._8_4_ = 0x3f800000;
      auVar159._0_8_ = &DAT_3f8000003f800000;
      auVar159._12_4_ = 0x3f800000;
      auVar124 = vsubps_avx(auVar159,auVar114);
      tray.rdir.field_0._0_4_ = fVar52 + fVar52 * auVar124._0_4_;
      tray.rdir.field_0._4_4_ = fVar53 + fVar53 * auVar124._4_4_;
      tray.rdir.field_0._8_4_ = fVar54 + fVar54 * auVar124._8_4_;
      tray.rdir.field_0._12_4_ = fVar75 + fVar75 * auVar124._12_4_;
      auVar124 = vrcpps_avx(auVar125);
      fVar52 = auVar124._0_4_;
      auVar123._0_4_ = auVar125._0_4_ * fVar52;
      fVar53 = auVar124._4_4_;
      auVar123._4_4_ = auVar125._4_4_ * fVar53;
      fVar54 = auVar124._8_4_;
      auVar123._8_4_ = auVar125._8_4_ * fVar54;
      fVar75 = auVar124._12_4_;
      auVar123._12_4_ = auVar125._12_4_ * fVar75;
      auVar124 = vsubps_avx(auVar159,auVar123);
      tray.rdir.field_0._16_4_ = fVar52 + fVar52 * auVar124._0_4_;
      tray.rdir.field_0._20_4_ = fVar53 + fVar53 * auVar124._4_4_;
      tray.rdir.field_0._24_4_ = fVar54 + fVar54 * auVar124._8_4_;
      tray.rdir.field_0._28_4_ = fVar75 + fVar75 * auVar124._12_4_;
      auVar124 = vrcpps_avx(auVar57);
      fVar52 = auVar124._0_4_;
      auVar135._0_4_ = auVar57._0_4_ * fVar52;
      fVar53 = auVar124._4_4_;
      auVar135._4_4_ = auVar57._4_4_ * fVar53;
      fVar54 = auVar124._8_4_;
      auVar135._8_4_ = auVar57._8_4_ * fVar54;
      fVar75 = auVar124._12_4_;
      auVar135._12_4_ = auVar57._12_4_ * fVar75;
      auVar57 = vsubps_avx(auVar159,auVar135);
      tray.rdir.field_0._32_4_ = fVar52 + fVar52 * auVar57._0_4_;
      tray.rdir.field_0._36_4_ = fVar53 + fVar53 * auVar57._4_4_;
      tray.rdir.field_0._40_4_ = fVar54 + fVar54 * auVar57._8_4_;
      tray.rdir.field_0._44_4_ = fVar75 + fVar75 * auVar57._12_4_;
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar55,1);
      auVar148._8_4_ = 0x10;
      auVar148._0_8_ = 0x1000000010;
      auVar148._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar57,auVar148);
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar55,5);
      auVar124._8_4_ = 0x20;
      auVar124._0_8_ = 0x2000000020;
      auVar124._12_4_ = 0x20;
      auVar149._8_4_ = 0x30;
      auVar149._0_8_ = 0x3000000030;
      auVar149._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar149,auVar124,auVar57);
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar55,5);
      auVar125._8_4_ = 0x40;
      auVar125._0_8_ = 0x4000000040;
      auVar125._12_4_ = 0x40;
      auVar136._8_4_ = 0x50;
      auVar136._0_8_ = 0x5000000050;
      auVar136._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar136,auVar125,auVar57);
      auVar57 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar55);
      auVar124 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar55);
      auVar55._8_4_ = 0x7f800000;
      auVar55._0_8_ = 0x7f8000007f800000;
      auVar55._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar55,auVar57,auVar73);
      auVar57._8_4_ = 0xff800000;
      auVar57._0_8_ = 0xff800000ff800000;
      auVar57._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar57,auVar124,auVar73);
      terminated.field_0.i[1] = auVar73._4_4_ ^ auVar62._4_4_;
      terminated.field_0.i[0] = auVar73._0_4_ ^ auVar62._0_4_;
      terminated.field_0.i[2] = auVar73._8_4_ ^ auVar62._8_4_;
      terminated.field_0.i[3] = auVar73._12_4_ ^ auVar62._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar28 = 3;
      }
      else {
        uVar28 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar36 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar34 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      do {
        paVar34 = paVar34 + -1;
        root.ptr = pNVar36[-1].ptr;
        pNVar36 = pNVar36 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00329344:
          iVar21 = 3;
        }
        else {
          aVar56 = *paVar34;
          auVar62 = vcmpps_avx((undefined1  [16])aVar56,(undefined1  [16])tray.tfar.field_0,1);
          uVar20 = vmovmskps_avx(auVar62);
          if (uVar20 == 0) {
LAB_00329355:
            iVar21 = 2;
          }
          else {
            uVar27 = (ulong)(uVar20 & 0xff);
            uVar20 = POPCOUNT(uVar20 & 0xff);
            iVar21 = 0;
            if (uVar20 <= uVar28) {
              do {
                sVar35 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> sVar35 & 1) == 0; sVar35 = sVar35 + 1) {
                  }
                }
                bVar37 = occluded1(This,bvh,root,sVar35,&pre,ray,&tray,context);
                if (bVar37) {
                  terminated.field_0.i[sVar35] = -1;
                }
                uVar27 = uVar27 & uVar27 - 1;
              } while (uVar27 != 0);
              auVar62 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
              iVar21 = 3;
              if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar62[0xf] < '\0') {
                auVar62._8_4_ = 0xff800000;
                auVar62._0_8_ = 0xff800000ff800000;
                auVar62._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar62,
                                   (undefined1  [16])terminated.field_0);
                iVar21 = 2;
              }
            }
            auVar74 = ZEXT1664((undefined1  [16])aVar56);
            if (uVar28 < uVar20) {
              do {
                uVar20 = (uint)root.ptr;
                auVar62 = auVar74._0_16_;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_00329344;
                  auVar57 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar62,6);
                  if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar57[0xf] < '\0') {
                    uVar27 = (ulong)(uVar20 & 0xf);
                    if (uVar27 == 8) {
                      auVar62 = vpcmpeqd_avx(auVar62,auVar62);
                      aVar51 = terminated.field_0;
                    }
                    else {
                      auVar129._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                      auVar129._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                      auVar129._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                      uVar22 = 0;
                      do {
                        lVar33 = uVar22 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                        uVar24 = vmovmskps_avx(auVar129);
                        uVar23 = CONCAT44((int)(uVar22 >> 0x20),uVar24);
                        auVar74 = ZEXT1664(auVar129);
                        uVar26 = 0;
                        while( true ) {
                          auVar62 = auVar74._0_16_;
                          uVar20 = *(uint *)(lVar33 + 0x50 + uVar26 * 4);
                          if (uVar20 == 0xffffffff) break;
                          uVar179 = *(uint *)(lVar33 + 0x40 + uVar26 * 4);
                          pGVar4 = (context->scene->geometries).items[uVar179].ptr;
                          fVar52 = (pGVar4->time_range).lower;
                          auVar39._4_4_ = fVar52;
                          auVar39._0_4_ = fVar52;
                          auVar39._8_4_ = fVar52;
                          auVar39._12_4_ = fVar52;
                          fVar53 = pGVar4->fnumTimeSegments;
                          auVar124 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar39);
                          auVar57 = ZEXT416((uint)((pGVar4->time_range).upper - fVar52));
                          auVar57 = vshufps_avx(auVar57,auVar57,0);
                          auVar57 = vdivps_avx(auVar124,auVar57);
                          auVar40._0_4_ = fVar53 * auVar57._0_4_;
                          auVar40._4_4_ = fVar53 * auVar57._4_4_;
                          auVar40._8_4_ = fVar53 * auVar57._8_4_;
                          auVar40._12_4_ = fVar53 * auVar57._12_4_;
                          auVar57 = vroundps_avx(auVar40,1);
                          auVar124 = vshufps_avx(ZEXT416((uint)(fVar53 + -1.0)),
                                                 ZEXT416((uint)(fVar53 + -1.0)),0);
                          auVar57 = vminps_avx(auVar57,auVar124);
                          auVar57 = vmaxps_avx(auVar57,_DAT_01feba10);
                          auVar124 = vsubps_avx(auVar40,auVar57);
                          itime.field_0 =
                               (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar57);
                          uVar25 = 0;
                          if (uVar23 != 0) {
                            for (; (uVar23 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                            }
                          }
                          auVar57 = vpshufd_avx(ZEXT416((uint)itime.field_0.i[uVar25]),0);
                          auVar57 = vpcmpeqd_avx(auVar57,(undefined1  [16])itime.field_0);
                          auVar57 = auVar129 & ~auVar57;
                          fVar53 = auVar124._4_4_;
                          fVar54 = auVar124._8_4_;
                          fVar75 = auVar124._12_4_;
                          fVar52 = auVar124._0_4_;
                          if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               && (auVar57 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar57 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar57[0xf]) {
                            lVar29 = (long)itime.field_0.i[uVar25] * 0x38;
                            lVar5 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar29);
                            lVar29 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar29);
                            uVar25 = (ulong)*(uint *)(lVar33 + uVar26 * 4);
                            uVar32 = (ulong)*(uint *)(lVar33 + 0x10 + uVar26 * 4);
                            fVar38 = *(float *)(lVar5 + uVar25 * 4);
                            fVar76 = *(float *)(lVar5 + 4 + uVar25 * 4);
                            fVar77 = *(float *)(lVar5 + 8 + uVar25 * 4);
                            fVar78 = *(float *)(lVar29 + uVar25 * 4);
                            fVar79 = *(float *)(lVar29 + 4 + uVar25 * 4);
                            fVar80 = *(float *)(lVar29 + 8 + uVar25 * 4);
                            auVar58._8_4_ = 0x3f800000;
                            auVar58._0_8_ = &DAT_3f8000003f800000;
                            auVar58._12_4_ = 0x3f800000;
                            auVar57 = vsubps_avx(auVar58,auVar124);
                            fVar81 = auVar57._0_4_;
                            fVar82 = auVar57._4_4_;
                            fVar83 = auVar57._8_4_;
                            fVar96 = auVar57._12_4_;
                            auVar86._0_4_ = fVar81 * fVar38 + fVar52 * fVar78;
                            auVar86._4_4_ = fVar82 * fVar38 + fVar53 * fVar78;
                            auVar86._8_4_ = fVar83 * fVar38 + fVar54 * fVar78;
                            auVar86._12_4_ = fVar96 * fVar38 + fVar75 * fVar78;
                            auVar118._0_4_ = fVar81 * fVar76 + fVar52 * fVar79;
                            auVar118._4_4_ = fVar82 * fVar76 + fVar53 * fVar79;
                            auVar118._8_4_ = fVar83 * fVar76 + fVar54 * fVar79;
                            auVar118._12_4_ = fVar96 * fVar76 + fVar75 * fVar79;
                            auVar204._0_4_ = fVar81 * fVar77 + fVar52 * fVar80;
                            auVar204._4_4_ = fVar82 * fVar77 + fVar53 * fVar80;
                            auVar204._8_4_ = fVar83 * fVar77 + fVar54 * fVar80;
                            auVar204._12_4_ = fVar96 * fVar77 + fVar75 * fVar80;
                            fVar38 = *(float *)(lVar5 + uVar32 * 4);
                            fVar76 = *(float *)(lVar5 + 4 + uVar32 * 4);
                            fVar77 = *(float *)(lVar5 + 8 + uVar32 * 4);
                            fVar78 = *(float *)(lVar29 + uVar32 * 4);
                            fVar79 = *(float *)(lVar29 + 4 + uVar32 * 4);
                            fVar80 = *(float *)(lVar29 + 8 + uVar32 * 4);
                            auVar178._0_4_ = fVar78 * fVar52 + fVar81 * fVar38;
                            auVar178._4_4_ = fVar78 * fVar53 + fVar82 * fVar38;
                            auVar178._8_4_ = fVar78 * fVar54 + fVar83 * fVar38;
                            auVar178._12_4_ = fVar78 * fVar75 + fVar96 * fVar38;
                            auVar187._0_4_ = fVar79 * fVar52 + fVar81 * fVar76;
                            auVar187._4_4_ = fVar79 * fVar53 + fVar82 * fVar76;
                            auVar187._8_4_ = fVar79 * fVar54 + fVar83 * fVar76;
                            auVar187._12_4_ = fVar79 * fVar75 + fVar96 * fVar76;
                            auVar194._0_4_ = fVar80 * fVar52 + fVar81 * fVar77;
                            auVar194._4_4_ = fVar80 * fVar53 + fVar82 * fVar77;
                            auVar194._8_4_ = fVar80 * fVar54 + fVar83 * fVar77;
                            auVar194._12_4_ = fVar80 * fVar75 + fVar96 * fVar77;
                            uVar25 = (ulong)*(uint *)(lVar33 + 0x20 + uVar26 * 4);
                            fVar38 = *(float *)(lVar5 + uVar25 * 4);
                            fVar76 = *(float *)(lVar5 + 4 + uVar25 * 4);
                            fVar77 = *(float *)(lVar5 + 8 + uVar25 * 4);
                            fVar78 = *(float *)(lVar29 + uVar25 * 4);
                            fVar79 = *(float *)(lVar29 + 4 + uVar25 * 4);
                            fVar80 = *(float *)(lVar29 + 8 + uVar25 * 4);
                            local_1848 = fVar78 * fVar52 + fVar81 * fVar38;
                            fStack_1844 = fVar78 * fVar53 + fVar82 * fVar38;
                            fStack_1840 = fVar78 * fVar54 + fVar83 * fVar38;
                            fStack_183c = fVar78 * fVar75 + fVar96 * fVar38;
                            local_1858 = fVar79 * fVar52 + fVar81 * fVar76;
                            fStack_1854 = fVar79 * fVar53 + fVar82 * fVar76;
                            fStack_1850 = fVar79 * fVar54 + fVar83 * fVar76;
                            fStack_184c = fVar79 * fVar75 + fVar96 * fVar76;
                            local_1818 = fVar80 * fVar52 + fVar81 * fVar77;
                            fStack_1814 = fVar80 * fVar53 + fVar82 * fVar77;
                            fStack_1810 = fVar80 * fVar54 + fVar83 * fVar77;
                            fStack_180c = fVar80 * fVar75 + fVar96 * fVar77;
                            uVar25 = (ulong)*(uint *)(lVar33 + 0x30 + uVar26 * 4);
                            fVar38 = *(float *)(lVar29 + uVar25 * 4);
                            fVar76 = *(float *)(lVar29 + 4 + uVar25 * 4);
                            fVar77 = *(float *)(lVar29 + 8 + uVar25 * 4);
                            fVar78 = *(float *)(lVar5 + uVar25 * 4);
                            auVar165._0_4_ = fVar81 * fVar78 + fVar52 * fVar38;
                            auVar165._4_4_ = fVar82 * fVar78 + fVar53 * fVar38;
                            auVar165._8_4_ = fVar83 * fVar78 + fVar54 * fVar38;
                            auVar165._12_4_ = fVar96 * fVar78 + fVar75 * fVar38;
                            fVar38 = *(float *)(lVar5 + 4 + uVar25 * 4);
                            auVar151._0_4_ = fVar81 * fVar38 + fVar52 * fVar76;
                            auVar151._4_4_ = fVar82 * fVar38 + fVar53 * fVar76;
                            auVar151._8_4_ = fVar83 * fVar38 + fVar54 * fVar76;
                            auVar151._12_4_ = fVar96 * fVar38 + fVar75 * fVar76;
                            fVar38 = *(float *)(lVar5 + 8 + uVar25 * 4);
                            auVar41._0_4_ = fVar81 * fVar38 + fVar52 * fVar77;
                            auVar41._4_4_ = fVar82 * fVar38 + fVar53 * fVar77;
                            auVar41._8_4_ = fVar83 * fVar38 + fVar54 * fVar77;
                            auVar41._12_4_ = fVar96 * fVar38 + fVar75 * fVar77;
                          }
                          else {
                            if (uVar23 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar30 = (ulong)*(uint *)(lVar33 + uVar26 * 4);
                              uVar31 = uVar23;
                              uVar32 = uVar25;
                              do {
                                lVar29 = (long)itime.field_0.i[uVar32] * 0x38;
                                auVar57 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar29) + uVar30 * 4);
                                puVar2 = (undefined4 *)
                                         (*(long *)(lVar5 + 0x38 + lVar29) + uVar30 * 4);
                                uVar8 = *puVar2;
                                uVar9 = puVar2[1];
                                uVar10 = puVar2[2];
                                *(int *)((long)&p0.field_0 + uVar32 * 4) = auVar57._0_4_;
                                uVar24 = vextractps_avx(auVar57,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar32 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar57,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar32 * 4 + 0x20) = uVar24;
                                *(undefined4 *)((long)&p1.field_0 + uVar32 * 4) = uVar8;
                                *(undefined4 *)((long)&p1.field_0 + uVar32 * 4 + 0x10) = uVar9;
                                *(undefined4 *)((long)&p1.field_0 + uVar32 * 4 + 0x20) = uVar10;
                                uVar31 = uVar31 ^ 1L << (uVar32 & 0x3f);
                                uVar32 = 0;
                                if (uVar31 != 0) {
                                  for (; (uVar31 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                  }
                                }
                              } while (uVar31 != 0);
                            }
                            auVar66._8_4_ = 0x3f800000;
                            auVar66._0_8_ = &DAT_3f8000003f800000;
                            auVar66._12_4_ = 0x3f800000;
                            auVar57 = vsubps_avx(auVar66,auVar124);
                            fVar38 = auVar57._0_4_;
                            fVar79 = fVar38 * (float)p0.field_0._0_4_;
                            fVar76 = auVar57._4_4_;
                            fVar96 = fVar76 * (float)p0.field_0._4_4_;
                            fVar77 = auVar57._8_4_;
                            fVar102 = fVar77 * (float)p0.field_0._8_4_;
                            fVar78 = auVar57._12_4_;
                            fVar108 = fVar78 * (float)p0.field_0._12_4_;
                            fVar80 = fVar38 * (float)p0.field_0._16_4_;
                            fVar97 = fVar76 * (float)p0.field_0._20_4_;
                            fVar103 = fVar77 * (float)p0.field_0._24_4_;
                            fVar109 = fVar78 * (float)p0.field_0._28_4_;
                            fVar81 = fVar38 * (float)p0.field_0._32_4_;
                            fVar98 = fVar76 * (float)p0.field_0._36_4_;
                            fVar104 = fVar77 * (float)p0.field_0._40_4_;
                            fVar110 = fVar78 * (float)p0.field_0._44_4_;
                            fVar82 = fVar52 * (float)p1.field_0._0_4_;
                            fVar99 = fVar53 * (float)p1.field_0._4_4_;
                            fVar105 = fVar54 * (float)p1.field_0._8_4_;
                            fVar111 = fVar75 * (float)p1.field_0._12_4_;
                            fVar83 = fVar52 * (float)p1.field_0._16_4_;
                            fVar100 = fVar53 * (float)p1.field_0._20_4_;
                            fVar106 = fVar54 * (float)p1.field_0._24_4_;
                            fVar112 = fVar75 * (float)p1.field_0._28_4_;
                            fVar202 = fVar52 * (float)p1.field_0._32_4_;
                            fVar209 = fVar53 * (float)p1.field_0._36_4_;
                            fVar210 = fVar54 * (float)p1.field_0._40_4_;
                            fVar211 = fVar75 * (float)p1.field_0._44_4_;
                            if (uVar23 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar30 = (ulong)*(uint *)(lVar33 + 0x10 + uVar26 * 4);
                              uVar31 = uVar23;
                              uVar32 = uVar25;
                              do {
                                lVar29 = (long)itime.field_0.i[uVar32] * 0x38;
                                auVar57 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar29) + uVar30 * 4);
                                auVar124 = *(undefined1 (*) [16])
                                            (*(long *)(lVar5 + 0x38 + lVar29) + uVar30 * 4);
                                *(int *)((long)&p0.field_0 + uVar32 * 4) = auVar57._0_4_;
                                uVar24 = vextractps_avx(auVar57,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar32 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar57,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar32 * 4 + 0x20) = uVar24;
                                *(int *)((long)&p1.field_0 + uVar32 * 4) = auVar124._0_4_;
                                uVar24 = vextractps_avx(auVar124,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar32 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar124,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar32 * 4 + 0x20) = uVar24;
                                uVar31 = uVar31 ^ 1L << (uVar32 & 0x3f);
                                uVar32 = 0;
                                if (uVar31 != 0) {
                                  for (; (uVar31 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                  }
                                }
                              } while (uVar31 != 0);
                            }
                            fVar84 = fVar38 * (float)p0.field_0._0_4_;
                            fVar101 = fVar76 * (float)p0.field_0._4_4_;
                            fVar107 = fVar77 * (float)p0.field_0._8_4_;
                            fVar113 = fVar78 * (float)p0.field_0._12_4_;
                            fVar166 = fVar38 * (float)p0.field_0._16_4_;
                            fVar169 = fVar76 * (float)p0.field_0._20_4_;
                            fVar170 = fVar77 * (float)p0.field_0._24_4_;
                            fVar171 = fVar78 * (float)p0.field_0._28_4_;
                            fVar172 = fVar38 * (float)p0.field_0._32_4_;
                            fVar174 = fVar76 * (float)p0.field_0._36_4_;
                            fVar175 = fVar77 * (float)p0.field_0._40_4_;
                            fVar176 = fVar78 * (float)p0.field_0._44_4_;
                            fVar177 = fVar52 * (float)p1.field_0._0_4_;
                            fVar180 = fVar53 * (float)p1.field_0._4_4_;
                            fVar182 = fVar54 * (float)p1.field_0._8_4_;
                            fVar184 = fVar75 * (float)p1.field_0._12_4_;
                            fVar185 = fVar52 * (float)p1.field_0._16_4_;
                            fVar189 = fVar53 * (float)p1.field_0._20_4_;
                            fVar190 = fVar54 * (float)p1.field_0._24_4_;
                            fVar191 = fVar75 * (float)p1.field_0._28_4_;
                            fVar192 = fVar52 * (float)p1.field_0._32_4_;
                            fVar197 = fVar53 * (float)p1.field_0._36_4_;
                            fVar199 = fVar54 * (float)p1.field_0._40_4_;
                            fVar201 = fVar75 * (float)p1.field_0._44_4_;
                            if (uVar23 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar30 = (ulong)*(uint *)(lVar33 + 0x20 + uVar26 * 4);
                              uVar31 = uVar23;
                              uVar32 = uVar25;
                              do {
                                lVar29 = (long)itime.field_0.i[uVar32] * 0x38;
                                auVar57 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar29) + uVar30 * 4);
                                auVar124 = *(undefined1 (*) [16])
                                            (*(long *)(lVar5 + 0x38 + lVar29) + uVar30 * 4);
                                *(int *)((long)&p0.field_0 + uVar32 * 4) = auVar57._0_4_;
                                uVar24 = vextractps_avx(auVar57,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar32 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar57,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar32 * 4 + 0x20) = uVar24;
                                *(int *)((long)&p1.field_0 + uVar32 * 4) = auVar124._0_4_;
                                uVar24 = vextractps_avx(auVar124,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar32 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar124,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar32 * 4 + 0x20) = uVar24;
                                uVar31 = uVar31 ^ 1L << (uVar32 & 0x3f);
                                uVar32 = 0;
                                if (uVar31 != 0) {
                                  for (; (uVar31 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                                  }
                                }
                              } while (uVar31 != 0);
                            }
                            local_1848 = fVar38 * (float)p0.field_0._0_4_;
                            fStack_1844 = fVar76 * (float)p0.field_0._4_4_;
                            fStack_1840 = fVar77 * (float)p0.field_0._8_4_;
                            fStack_183c = fVar78 * (float)p0.field_0._12_4_;
                            fVar147 = fVar38 * (float)p0.field_0._16_4_;
                            fVar154 = fVar76 * (float)p0.field_0._20_4_;
                            fVar155 = fVar77 * (float)p0.field_0._24_4_;
                            fVar156 = fVar78 * (float)p0.field_0._28_4_;
                            fVar122 = fVar38 * (float)p0.field_0._32_4_;
                            fVar132 = fVar76 * (float)p0.field_0._36_4_;
                            fVar133 = fVar77 * (float)p0.field_0._40_4_;
                            fVar134 = fVar78 * (float)p0.field_0._44_4_;
                            fVar157 = fVar52 * (float)p1.field_0._0_4_;
                            fVar162 = fVar53 * (float)p1.field_0._4_4_;
                            fVar163 = fVar54 * (float)p1.field_0._8_4_;
                            fVar164 = fVar75 * (float)p1.field_0._12_4_;
                            local_1858 = fVar52 * (float)p1.field_0._16_4_;
                            fStack_1854 = fVar53 * (float)p1.field_0._20_4_;
                            fStack_1850 = fVar54 * (float)p1.field_0._24_4_;
                            fStack_184c = fVar75 * (float)p1.field_0._28_4_;
                            local_1818 = fVar52 * (float)p1.field_0._32_4_;
                            fStack_1814 = fVar53 * (float)p1.field_0._36_4_;
                            fStack_1810 = fVar54 * (float)p1.field_0._40_4_;
                            fStack_180c = fVar75 * (float)p1.field_0._44_4_;
                            if (uVar23 != 0) {
                              lVar5 = *(long *)&pGVar4[2].numPrimitives;
                              uVar31 = (ulong)*(uint *)(lVar33 + 0x30 + uVar26 * 4);
                              uVar32 = uVar23;
                              do {
                                lVar29 = (long)itime.field_0.i[uVar25] * 0x38;
                                auVar57 = *(undefined1 (*) [16])
                                           (*(long *)(lVar5 + lVar29) + uVar31 * 4);
                                auVar124 = *(undefined1 (*) [16])
                                            (*(long *)(lVar5 + 0x38 + lVar29) + uVar31 * 4);
                                *(int *)((long)&p0.field_0 + uVar25 * 4) = auVar57._0_4_;
                                uVar24 = vextractps_avx(auVar57,1);
                                *(undefined4 *)((long)&p0.field_0 + uVar25 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar57,2);
                                *(undefined4 *)((long)&p0.field_0 + uVar25 * 4 + 0x20) = uVar24;
                                *(int *)((long)&p1.field_0 + uVar25 * 4) = auVar124._0_4_;
                                uVar24 = vextractps_avx(auVar124,1);
                                *(undefined4 *)((long)&p1.field_0 + uVar25 * 4 + 0x10) = uVar24;
                                uVar24 = vextractps_avx(auVar124,2);
                                *(undefined4 *)((long)&p1.field_0 + uVar25 * 4 + 0x20) = uVar24;
                                uVar32 = uVar32 ^ 1L << (uVar25 & 0x3f);
                                uVar25 = 0;
                                if (uVar32 != 0) {
                                  for (; (uVar32 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                                  }
                                }
                              } while (uVar32 != 0);
                            }
                            auVar86._0_4_ = fVar82 + fVar79;
                            auVar86._4_4_ = fVar99 + fVar96;
                            auVar86._8_4_ = fVar105 + fVar102;
                            auVar86._12_4_ = fVar111 + fVar108;
                            auVar118._0_4_ = fVar83 + fVar80;
                            auVar118._4_4_ = fVar100 + fVar97;
                            auVar118._8_4_ = fVar106 + fVar103;
                            auVar118._12_4_ = fVar112 + fVar109;
                            auVar204._0_4_ = fVar202 + fVar81;
                            auVar204._4_4_ = fVar209 + fVar98;
                            auVar204._8_4_ = fVar210 + fVar104;
                            auVar204._12_4_ = fVar211 + fVar110;
                            auVar178._0_4_ = fVar177 + fVar84;
                            auVar178._4_4_ = fVar180 + fVar101;
                            auVar178._8_4_ = fVar182 + fVar107;
                            auVar178._12_4_ = fVar184 + fVar113;
                            auVar187._0_4_ = fVar166 + fVar185;
                            auVar187._4_4_ = fVar169 + fVar189;
                            auVar187._8_4_ = fVar170 + fVar190;
                            auVar187._12_4_ = fVar171 + fVar191;
                            auVar194._0_4_ = fVar172 + fVar192;
                            auVar194._4_4_ = fVar174 + fVar197;
                            auVar194._8_4_ = fVar175 + fVar199;
                            auVar194._12_4_ = fVar176 + fVar201;
                            local_1848 = local_1848 + fVar157;
                            fStack_1844 = fStack_1844 + fVar162;
                            fStack_1840 = fStack_1840 + fVar163;
                            fStack_183c = fStack_183c + fVar164;
                            local_1858 = local_1858 + fVar147;
                            fStack_1854 = fStack_1854 + fVar154;
                            fStack_1850 = fStack_1850 + fVar155;
                            fStack_184c = fStack_184c + fVar156;
                            local_1818 = local_1818 + fVar122;
                            fStack_1814 = fStack_1814 + fVar132;
                            fStack_1810 = fStack_1810 + fVar133;
                            fStack_180c = fStack_180c + fVar134;
                            auVar165._0_4_ =
                                 fVar38 * (float)p0.field_0._0_4_ + fVar52 * (float)p1.field_0._0_4_
                            ;
                            auVar165._4_4_ =
                                 fVar76 * (float)p0.field_0._4_4_ + fVar53 * (float)p1.field_0._4_4_
                            ;
                            auVar165._8_4_ =
                                 fVar77 * (float)p0.field_0._8_4_ + fVar54 * (float)p1.field_0._8_4_
                            ;
                            auVar165._12_4_ =
                                 fVar78 * (float)p0.field_0._12_4_ +
                                 fVar75 * (float)p1.field_0._12_4_;
                            auVar151._0_4_ =
                                 fVar38 * (float)p0.field_0._16_4_ +
                                 fVar52 * (float)p1.field_0._16_4_;
                            auVar151._4_4_ =
                                 fVar76 * (float)p0.field_0._20_4_ +
                                 fVar53 * (float)p1.field_0._20_4_;
                            auVar151._8_4_ =
                                 fVar77 * (float)p0.field_0._24_4_ +
                                 fVar54 * (float)p1.field_0._24_4_;
                            auVar151._12_4_ =
                                 fVar78 * (float)p0.field_0._28_4_ +
                                 fVar75 * (float)p1.field_0._28_4_;
                            auVar41._0_4_ =
                                 fVar38 * (float)p0.field_0._32_4_ +
                                 fVar52 * (float)p1.field_0._32_4_;
                            auVar41._4_4_ =
                                 fVar76 * (float)p0.field_0._36_4_ +
                                 fVar53 * (float)p1.field_0._36_4_;
                            auVar41._8_4_ =
                                 fVar77 * (float)p0.field_0._40_4_ +
                                 fVar54 * (float)p1.field_0._40_4_;
                            auVar41._12_4_ =
                                 fVar78 * (float)p0.field_0._44_4_ +
                                 fVar75 * (float)p1.field_0._44_4_;
                          }
                          auVar57 = vsubps_avx(auVar86,auVar178);
                          auVar124 = vsubps_avx(auVar118,auVar187);
                          auVar55 = vsubps_avx(auVar204,auVar194);
                          auVar125 = vsubps_avx(auVar165,auVar86);
                          auVar123 = vsubps_avx(auVar151,auVar118);
                          auVar114 = vsubps_avx(auVar41,auVar204);
                          fVar52 = auVar114._0_4_;
                          fVar166 = auVar124._0_4_;
                          auVar59._0_4_ = fVar166 * fVar52;
                          fVar38 = auVar114._4_4_;
                          fVar169 = auVar124._4_4_;
                          auVar59._4_4_ = fVar169 * fVar38;
                          fVar79 = auVar114._8_4_;
                          fVar170 = auVar124._8_4_;
                          auVar59._8_4_ = fVar170 * fVar79;
                          fVar83 = auVar114._12_4_;
                          fVar171 = auVar124._12_4_;
                          auVar59._12_4_ = fVar171 * fVar83;
                          fVar53 = auVar55._0_4_;
                          fVar177 = auVar123._0_4_;
                          auVar140._0_4_ = fVar177 * fVar53;
                          fVar76 = auVar55._4_4_;
                          fVar180 = auVar123._4_4_;
                          auVar140._4_4_ = fVar180 * fVar76;
                          fVar80 = auVar55._8_4_;
                          fVar182 = auVar123._8_4_;
                          auVar140._8_4_ = fVar182 * fVar80;
                          fVar96 = auVar55._12_4_;
                          fVar184 = auVar123._12_4_;
                          auVar140._12_4_ = fVar184 * fVar96;
                          auVar124 = vsubps_avx(auVar140,auVar59);
                          fVar172 = auVar125._0_4_;
                          auVar60._0_4_ = fVar172 * fVar53;
                          fVar174 = auVar125._4_4_;
                          auVar60._4_4_ = fVar174 * fVar76;
                          fVar175 = auVar125._8_4_;
                          auVar60._8_4_ = fVar175 * fVar80;
                          fVar176 = auVar125._12_4_;
                          auVar60._12_4_ = fVar176 * fVar96;
                          fVar202 = auVar57._0_4_;
                          auVar141._0_4_ = fVar202 * fVar52;
                          fVar209 = auVar57._4_4_;
                          auVar141._4_4_ = fVar209 * fVar38;
                          fVar210 = auVar57._8_4_;
                          auVar141._8_4_ = fVar210 * fVar79;
                          fVar211 = auVar57._12_4_;
                          auVar141._12_4_ = fVar211 * fVar83;
                          auVar55 = vsubps_avx(auVar141,auVar60);
                          auVar142._0_4_ = fVar177 * fVar202;
                          auVar142._4_4_ = fVar180 * fVar209;
                          auVar142._8_4_ = fVar182 * fVar210;
                          auVar142._12_4_ = fVar184 * fVar211;
                          auVar152._0_4_ = fVar172 * fVar166;
                          auVar152._4_4_ = fVar174 * fVar169;
                          auVar152._8_4_ = fVar175 * fVar170;
                          auVar152._12_4_ = fVar176 * fVar171;
                          auVar125 = vsubps_avx(auVar152,auVar142);
                          auVar57 = vsubps_avx(auVar86,*(undefined1 (*) [16])ray);
                          auVar123 = vsubps_avx(auVar118,*(undefined1 (*) [16])(ray + 0x10));
                          auVar114 = vsubps_avx(auVar204,*(undefined1 (*) [16])(ray + 0x20));
                          fVar99 = *(float *)(ray + 0x50);
                          fVar100 = *(float *)(ray + 0x54);
                          fVar102 = *(float *)(ray + 0x58);
                          fVar103 = *(float *)(ray + 0x5c);
                          fVar104 = *(float *)(ray + 0x60);
                          fVar105 = *(float *)(ray + 100);
                          fVar106 = *(float *)(ray + 0x68);
                          fVar108 = *(float *)(ray + 0x6c);
                          fVar84 = auVar114._0_4_;
                          auVar119._0_4_ = fVar84 * fVar99;
                          fVar101 = auVar114._4_4_;
                          auVar119._4_4_ = fVar101 * fVar100;
                          fVar107 = auVar114._8_4_;
                          auVar119._8_4_ = fVar107 * fVar102;
                          fVar113 = auVar114._12_4_;
                          auVar119._12_4_ = fVar113 * fVar103;
                          fVar54 = auVar123._0_4_;
                          auVar205._0_4_ = fVar104 * fVar54;
                          fVar77 = auVar123._4_4_;
                          auVar205._4_4_ = fVar105 * fVar77;
                          fVar81 = auVar123._8_4_;
                          auVar205._8_4_ = fVar106 * fVar81;
                          fVar97 = auVar123._12_4_;
                          auVar205._12_4_ = fVar108 * fVar97;
                          auVar123 = vsubps_avx(auVar205,auVar119);
                          fVar109 = *(float *)(ray + 0x40);
                          fVar110 = *(float *)(ray + 0x44);
                          fVar111 = *(float *)(ray + 0x48);
                          fVar112 = *(float *)(ray + 0x4c);
                          fVar75 = auVar57._0_4_;
                          auVar206._0_4_ = fVar104 * fVar75;
                          fVar78 = auVar57._4_4_;
                          auVar206._4_4_ = fVar105 * fVar78;
                          fVar82 = auVar57._8_4_;
                          auVar206._8_4_ = fVar106 * fVar82;
                          fVar98 = auVar57._12_4_;
                          auVar206._12_4_ = fVar108 * fVar98;
                          auVar212._0_4_ = fVar84 * fVar109;
                          auVar212._4_4_ = fVar101 * fVar110;
                          auVar212._8_4_ = fVar107 * fVar111;
                          auVar212._12_4_ = fVar113 * fVar112;
                          auVar114 = vsubps_avx(auVar212,auVar206);
                          auVar213._0_4_ = fVar54 * fVar109;
                          auVar213._4_4_ = fVar77 * fVar110;
                          auVar213._8_4_ = fVar81 * fVar111;
                          auVar213._12_4_ = fVar97 * fVar112;
                          auVar143._0_4_ = fVar75 * fVar99;
                          auVar143._4_4_ = fVar78 * fVar100;
                          auVar143._8_4_ = fVar82 * fVar102;
                          auVar143._12_4_ = fVar98 * fVar103;
                          auVar135 = vsubps_avx(auVar143,auVar213);
                          auVar173._0_4_ =
                               auVar124._0_4_ * fVar109 +
                               auVar55._0_4_ * fVar99 + auVar125._0_4_ * fVar104;
                          auVar173._4_4_ =
                               auVar124._4_4_ * fVar110 +
                               auVar55._4_4_ * fVar100 + auVar125._4_4_ * fVar105;
                          auVar173._8_4_ =
                               auVar124._8_4_ * fVar111 +
                               auVar55._8_4_ * fVar102 + auVar125._8_4_ * fVar106;
                          auVar173._12_4_ =
                               auVar124._12_4_ * fVar112 +
                               auVar55._12_4_ * fVar103 + auVar125._12_4_ * fVar108;
                          auVar61._8_4_ = 0x80000000;
                          auVar61._0_8_ = 0x8000000080000000;
                          auVar61._12_4_ = 0x80000000;
                          auVar57 = vandps_avx(auVar173,auVar61);
                          uVar181 = auVar57._0_4_;
                          auVar87._0_4_ =
                               (float)(uVar181 ^
                                      (uint)(fVar172 * auVar123._0_4_ +
                                            fVar177 * auVar114._0_4_ + auVar135._0_4_ * fVar52));
                          uVar183 = auVar57._4_4_;
                          auVar87._4_4_ =
                               (float)(uVar183 ^
                                      (uint)(fVar174 * auVar123._4_4_ +
                                            fVar180 * auVar114._4_4_ + auVar135._4_4_ * fVar38));
                          uVar198 = auVar57._8_4_;
                          auVar87._8_4_ =
                               (float)(uVar198 ^
                                      (uint)(fVar175 * auVar123._8_4_ +
                                            fVar182 * auVar114._8_4_ + auVar135._8_4_ * fVar79));
                          uVar200 = auVar57._12_4_;
                          auVar87._12_4_ =
                               (float)(uVar200 ^
                                      (uint)(fVar176 * auVar123._12_4_ +
                                            fVar184 * auVar114._12_4_ + auVar135._12_4_ * fVar83));
                          auVar57 = vcmpps_avx(auVar87,_DAT_01feba10,5);
                          auVar74 = ZEXT1664(auVar62);
                          auVar136 = auVar62 & auVar57;
                          if ((((auVar136 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar136 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar136 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar136[0xf] < '\0') {
                            auVar57 = vandps_avx(auVar57,auVar62);
                            auVar121._0_4_ =
                                 (float)(uVar181 ^
                                        (uint)(auVar123._0_4_ * fVar202 +
                                              auVar114._0_4_ * fVar166 + fVar53 * auVar135._0_4_));
                            auVar121._4_4_ =
                                 (float)(uVar183 ^
                                        (uint)(auVar123._4_4_ * fVar209 +
                                              auVar114._4_4_ * fVar169 + fVar76 * auVar135._4_4_));
                            auVar121._8_4_ =
                                 (float)(uVar198 ^
                                        (uint)(auVar123._8_4_ * fVar210 +
                                              auVar114._8_4_ * fVar170 + fVar80 * auVar135._8_4_));
                            auVar121._12_4_ =
                                 (float)(uVar200 ^
                                        (uint)(auVar123._12_4_ * fVar211 +
                                              auVar114._12_4_ * fVar171 + fVar96 * auVar135._12_4_))
                            ;
                            auVar123 = vcmpps_avx(auVar121,_DAT_01feba10,5);
                            auVar114 = auVar57 & auVar123;
                            if ((((auVar114 >> 0x1f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0 &&
                                 (auVar114 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar114 >> 0x5f & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) && -1 < auVar114[0xf]) {
                              auVar74 = ZEXT1664(auVar62);
                            }
                            else {
                              auVar43._8_4_ = 0x7fffffff;
                              auVar43._0_8_ = 0x7fffffff7fffffff;
                              auVar43._12_4_ = 0x7fffffff;
                              auVar114 = vandps_avx(auVar173,auVar43);
                              auVar57 = vandps_avx(auVar123,auVar57);
                              auVar123 = vsubps_avx(auVar114,auVar87);
                              auVar123 = vcmpps_avx(auVar123,auVar121,5);
                              auVar135 = auVar57 & auVar123;
                              if ((((auVar135 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (auVar135 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar135 >> 0x5f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) || auVar135[0xf] < '\0') {
                                auVar57 = vandps_avx(auVar123,auVar57);
                                auVar131._0_4_ =
                                     (float)(uVar181 ^
                                            (uint)(auVar124._0_4_ * fVar75 +
                                                  auVar55._0_4_ * fVar54 + fVar84 * auVar125._0_4_))
                                ;
                                auVar131._4_4_ =
                                     (float)(uVar183 ^
                                            (uint)(auVar124._4_4_ * fVar78 +
                                                  auVar55._4_4_ * fVar77 + fVar101 * auVar125._4_4_)
                                            );
                                auVar131._8_4_ =
                                     (float)(uVar198 ^
                                            (uint)(auVar124._8_4_ * fVar82 +
                                                  auVar55._8_4_ * fVar81 + fVar107 * auVar125._8_4_)
                                            );
                                auVar131._12_4_ =
                                     (float)(uVar200 ^
                                            (uint)(auVar124._12_4_ * fVar98 +
                                                  auVar55._12_4_ * fVar97 +
                                                  fVar113 * auVar125._12_4_));
                                fVar52 = auVar114._0_4_;
                                auVar45._0_4_ = fVar52 * *(float *)(ray + 0x30);
                                fVar53 = auVar114._4_4_;
                                auVar45._4_4_ = fVar53 * *(float *)(ray + 0x34);
                                fVar54 = auVar114._8_4_;
                                auVar45._8_4_ = fVar54 * *(float *)(ray + 0x38);
                                fVar75 = auVar114._12_4_;
                                auVar45._12_4_ = fVar75 * *(float *)(ray + 0x3c);
                                auVar123 = vcmpps_avx(auVar45,auVar131,1);
                                auVar136 = *(undefined1 (*) [16])(ray + 0x80);
                                auVar67._0_4_ = fVar52 * *(float *)(ray + 0x80);
                                auVar67._4_4_ = fVar53 * *(float *)(ray + 0x84);
                                auVar67._8_4_ = fVar54 * *(float *)(ray + 0x88);
                                auVar67._12_4_ = fVar75 * *(float *)(ray + 0x8c);
                                auVar135 = vcmpps_avx(auVar131,auVar67,2);
                                auVar123 = vandps_avx(auVar135,auVar123);
                                auVar135 = auVar57 & auVar123;
                                if ((((auVar135 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar135 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar135 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar135[0xf] < '\0') {
                                  auVar57 = vandps_avx(auVar57,auVar123);
                                  auVar123 = vcmpps_avx(auVar173,_DAT_01feba10,4);
                                  auVar135 = auVar57 & auVar123;
                                  if ((((auVar135 >> 0x1f & (undefined1  [16])0x1) !=
                                        (undefined1  [16])0x0 ||
                                       (auVar135 >> 0x3f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                      (auVar135 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar135[0xf] < '\0') {
                                    auVar57 = vandps_avx(auVar123,auVar57);
                                    uVar181 = pGVar4->mask;
                                    auVar46._4_4_ = uVar181;
                                    auVar46._0_4_ = uVar181;
                                    auVar46._8_4_ = uVar181;
                                    auVar46._12_4_ = uVar181;
                                    auVar123 = vandps_avx(auVar46,*(undefined1 (*) [16])(ray + 0x90)
                                                         );
                                    auVar123 = vpcmpeqd_avx(auVar123,_DAT_01feba10);
                                    auVar135 = auVar57 & ~auVar123;
                                    if ((((auVar135 >> 0x1f & (undefined1  [16])0x1) !=
                                          (undefined1  [16])0x0 ||
                                         (auVar135 >> 0x3f & (undefined1  [16])0x1) !=
                                         (undefined1  [16])0x0) ||
                                        (auVar135 >> 0x5f & (undefined1  [16])0x1) !=
                                        (undefined1  [16])0x0) || auVar135[0xf] < '\0') {
                                      aVar161 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                                vandnps_avx(auVar123,auVar57);
                                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                         (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                        auVar57 = vrcpps_avx(auVar114);
                                        fVar38 = auVar57._0_4_;
                                        auVar69._0_4_ = fVar52 * fVar38;
                                        fVar52 = auVar57._4_4_;
                                        auVar69._4_4_ = fVar53 * fVar52;
                                        fVar53 = auVar57._8_4_;
                                        auVar69._8_4_ = fVar54 * fVar53;
                                        fVar54 = auVar57._12_4_;
                                        auVar69._12_4_ = fVar75 * fVar54;
                                        auVar146._8_4_ = 0x3f800000;
                                        auVar146._0_8_ = &DAT_3f8000003f800000;
                                        auVar146._12_4_ = 0x3f800000;
                                        auVar57 = vsubps_avx(auVar146,auVar69);
                                        fVar38 = fVar38 + fVar38 * auVar57._0_4_;
                                        fVar52 = fVar52 + fVar52 * auVar57._4_4_;
                                        fVar53 = fVar53 + fVar53 * auVar57._8_4_;
                                        fVar54 = fVar54 + fVar54 * auVar57._12_4_;
                                        auVar70._0_4_ = fVar38 * auVar87._0_4_;
                                        auVar70._4_4_ = fVar52 * auVar87._4_4_;
                                        auVar70._8_4_ = fVar53 * auVar87._8_4_;
                                        auVar70._12_4_ = fVar54 * auVar87._12_4_;
                                        auVar57 = vminps_avx(auVar70,auVar146);
                                        auVar91._0_4_ = fVar38 * auVar121._0_4_;
                                        auVar91._4_4_ = fVar52 * auVar121._4_4_;
                                        auVar91._8_4_ = fVar53 * auVar121._8_4_;
                                        auVar91._12_4_ = fVar54 * auVar121._12_4_;
                                        auVar123 = vminps_avx(auVar91,auVar146);
                                        auVar114 = vsubps_avx(auVar146,auVar57);
                                        auVar135 = vsubps_avx(auVar146,auVar123);
                                        auVar17._8_8_ = uVar19;
                                        auVar17._0_8_ = uVar18;
                                        auVar57 = vblendvps_avx(auVar57,auVar114,auVar17);
                                        vblendvps_avx(auVar123,auVar135,auVar17);
                                        vpshufd_avx(ZEXT416(uVar179),0);
                                        vpshufd_avx(ZEXT416(uVar20),0);
                                        p0.field_0._0_16_ = auVar124;
                                        p0.field_0._16_16_ = auVar55;
                                        p0.field_0._32_16_ = auVar125;
                                        auVar49._0_4_ = fVar38 * auVar131._0_4_;
                                        auVar49._4_4_ = fVar52 * auVar131._4_4_;
                                        auVar49._8_4_ = fVar53 * auVar131._8_4_;
                                        auVar49._12_4_ = fVar54 * auVar131._12_4_;
                                        vcmpps_avx(ZEXT1632(auVar57),ZEXT1632(auVar57),0xf);
                                        auVar57 = vblendvps_avx(auVar136,auVar49,
                                                                (undefined1  [16])aVar161);
                                        *(undefined1 (*) [16])(ray + 0x80) = auVar57;
                                        itime.field_0 = aVar161;
                                        p1.field_0._0_8_ = &itime;
                                        p1.field_0._8_8_ = pGVar4->userPtr;
                                        p1.field_0._16_8_ = context->user;
                                        p1.field_0._24_8_ = ray;
                                        p1.field_0._32_8_ = &p0;
                                        p1.field_0._40_4_ = 4;
                                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                          (*pGVar4->occlusionFilterN)
                                                    ((RTCFilterFunctionNArguments *)&p1);
                                        }
                                        if (itime.field_0 ==
                                            (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                          auVar57 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10
                                                                );
                                          auVar57 = auVar57 ^ _DAT_01febe20;
                                        }
                                        else {
                                          p_Var6 = context->args->filter;
                                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                             (((context->args->flags &
                                               RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                            (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                                          }
                                          auVar124 = vpcmpeqd_avx((undefined1  [16])0x0,
                                                                  (undefined1  [16])itime.field_0);
                                          auVar57 = auVar124 ^ _DAT_01febe20;
                                          auVar92._8_4_ = 0xff800000;
                                          auVar92._0_8_ = 0xff800000ff800000;
                                          auVar92._12_4_ = 0xff800000;
                                          auVar124 = vblendvps_avx(auVar92,*(undefined1 (*) [16])
                                                                            (p1.field_0._24_8_ +
                                                                            0x80),auVar124);
                                          *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) =
                                               auVar124;
                                        }
                                        auVar57 = vpslld_avx(auVar57,0x1f);
                                        aVar161 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                                  vpsrad_avx(auVar57,0x1f);
                                        auVar57 = vblendvps_avx(auVar136,*(undefined1 (*) [16])
                                                                          pRVar1,auVar57);
                                        *(undefined1 (*) [16])pRVar1 = auVar57;
                                      }
                                      auVar62 = vpandn_avx((undefined1  [16])aVar161,auVar62);
                                    }
                                  }
                                }
                              }
                              auVar74 = ZEXT1664(auVar62);
                            }
                          }
                          auVar62 = auVar74._0_16_;
                          if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               && (auVar62 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar62 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar74[0xf]) {
                            bVar37 = false;
                          }
                          else {
                            auVar12._4_4_ = fStack_1844;
                            auVar12._0_4_ = local_1848;
                            auVar12._8_4_ = fStack_1840;
                            auVar12._12_4_ = fStack_183c;
                            auVar57 = vsubps_avx(auVar12,auVar165);
                            auVar11._4_4_ = fStack_1854;
                            auVar11._0_4_ = local_1858;
                            auVar11._8_4_ = fStack_1850;
                            auVar11._12_4_ = fStack_184c;
                            auVar124 = vsubps_avx(auVar11,auVar151);
                            auVar13._4_4_ = fStack_1814;
                            auVar13._0_4_ = local_1818;
                            auVar13._8_4_ = fStack_1810;
                            auVar13._12_4_ = fStack_180c;
                            auVar55 = vsubps_avx(auVar13,auVar41);
                            auVar125 = vsubps_avx(auVar178,auVar12);
                            auVar123 = vsubps_avx(auVar187,auVar11);
                            auVar114 = vsubps_avx(auVar194,auVar13);
                            fVar52 = auVar124._0_4_;
                            fVar177 = auVar114._0_4_;
                            auVar42._0_4_ = fVar177 * fVar52;
                            fVar38 = auVar124._4_4_;
                            fVar180 = auVar114._4_4_;
                            auVar42._4_4_ = fVar180 * fVar38;
                            fVar79 = auVar124._8_4_;
                            fVar182 = auVar114._8_4_;
                            auVar42._8_4_ = fVar182 * fVar79;
                            fVar83 = auVar124._12_4_;
                            fVar184 = auVar114._12_4_;
                            auVar42._12_4_ = fVar184 * fVar83;
                            fVar53 = auVar123._0_4_;
                            fVar166 = auVar55._0_4_;
                            auVar63._0_4_ = fVar166 * fVar53;
                            fVar76 = auVar123._4_4_;
                            fVar169 = auVar55._4_4_;
                            auVar63._4_4_ = fVar169 * fVar76;
                            fVar80 = auVar123._8_4_;
                            fVar170 = auVar55._8_4_;
                            auVar63._8_4_ = fVar170 * fVar80;
                            fVar96 = auVar123._12_4_;
                            fVar171 = auVar55._12_4_;
                            auVar63._12_4_ = fVar171 * fVar96;
                            auVar124 = vsubps_avx(auVar63,auVar42);
                            fVar54 = auVar125._0_4_;
                            auVar64._0_4_ = fVar166 * fVar54;
                            fVar77 = auVar125._4_4_;
                            auVar64._4_4_ = fVar169 * fVar77;
                            fVar81 = auVar125._8_4_;
                            auVar64._8_4_ = fVar170 * fVar81;
                            fVar97 = auVar125._12_4_;
                            auVar64._12_4_ = fVar171 * fVar97;
                            fVar172 = auVar57._0_4_;
                            auVar88._0_4_ = fVar172 * fVar177;
                            fVar174 = auVar57._4_4_;
                            auVar88._4_4_ = fVar174 * fVar180;
                            fVar175 = auVar57._8_4_;
                            auVar88._8_4_ = fVar175 * fVar182;
                            fVar176 = auVar57._12_4_;
                            auVar88._12_4_ = fVar176 * fVar184;
                            auVar55 = vsubps_avx(auVar88,auVar64);
                            auVar89._0_4_ = fVar172 * fVar53;
                            auVar89._4_4_ = fVar174 * fVar76;
                            auVar89._8_4_ = fVar175 * fVar80;
                            auVar89._12_4_ = fVar176 * fVar96;
                            auVar144._0_4_ = fVar52 * fVar54;
                            auVar144._4_4_ = fVar38 * fVar77;
                            auVar144._8_4_ = fVar79 * fVar81;
                            auVar144._12_4_ = fVar83 * fVar97;
                            auVar125 = vsubps_avx(auVar144,auVar89);
                            auVar57 = vsubps_avx(auVar12,*(undefined1 (*) [16])ray);
                            auVar123 = vsubps_avx(auVar11,*(undefined1 (*) [16])(ray + 0x10));
                            auVar114 = vsubps_avx(auVar13,*(undefined1 (*) [16])(ray + 0x20));
                            fVar99 = *(float *)(ray + 0x50);
                            fVar100 = *(float *)(ray + 0x54);
                            fVar102 = *(float *)(ray + 0x58);
                            fVar103 = *(float *)(ray + 0x5c);
                            fVar104 = *(float *)(ray + 0x60);
                            fVar105 = *(float *)(ray + 100);
                            fVar106 = *(float *)(ray + 0x68);
                            fVar108 = *(float *)(ray + 0x6c);
                            fVar75 = auVar114._0_4_;
                            auVar188._0_4_ = fVar99 * fVar75;
                            fVar78 = auVar114._4_4_;
                            auVar188._4_4_ = fVar100 * fVar78;
                            fVar82 = auVar114._8_4_;
                            auVar188._8_4_ = fVar102 * fVar82;
                            fVar98 = auVar114._12_4_;
                            auVar188._12_4_ = fVar103 * fVar98;
                            fVar84 = auVar123._0_4_;
                            auVar195._0_4_ = fVar84 * fVar104;
                            fVar101 = auVar123._4_4_;
                            auVar195._4_4_ = fVar101 * fVar105;
                            fVar107 = auVar123._8_4_;
                            auVar195._8_4_ = fVar107 * fVar106;
                            fVar113 = auVar123._12_4_;
                            auVar195._12_4_ = fVar113 * fVar108;
                            auVar123 = vsubps_avx(auVar195,auVar188);
                            fVar109 = *(float *)(ray + 0x40);
                            fVar110 = *(float *)(ray + 0x44);
                            fVar111 = *(float *)(ray + 0x48);
                            fVar112 = *(float *)(ray + 0x4c);
                            fVar202 = auVar57._0_4_;
                            auVar196._0_4_ = fVar202 * fVar104;
                            fVar209 = auVar57._4_4_;
                            auVar196._4_4_ = fVar209 * fVar105;
                            fVar210 = auVar57._8_4_;
                            auVar196._8_4_ = fVar210 * fVar106;
                            fVar211 = auVar57._12_4_;
                            auVar196._12_4_ = fVar211 * fVar108;
                            auVar207._0_4_ = fVar75 * fVar109;
                            auVar207._4_4_ = fVar78 * fVar110;
                            auVar207._8_4_ = fVar82 * fVar111;
                            auVar207._12_4_ = fVar98 * fVar112;
                            auVar114 = vsubps_avx(auVar207,auVar196);
                            auVar208._0_4_ = fVar84 * fVar109;
                            auVar208._4_4_ = fVar101 * fVar110;
                            auVar208._8_4_ = fVar107 * fVar111;
                            auVar208._12_4_ = fVar113 * fVar112;
                            auVar90._0_4_ = fVar99 * fVar202;
                            auVar90._4_4_ = fVar100 * fVar209;
                            auVar90._8_4_ = fVar102 * fVar210;
                            auVar90._12_4_ = fVar103 * fVar211;
                            auVar135 = vsubps_avx(auVar90,auVar208);
                            auVar168._0_4_ =
                                 auVar124._0_4_ * fVar109 +
                                 fVar99 * auVar55._0_4_ + auVar125._0_4_ * fVar104;
                            auVar168._4_4_ =
                                 auVar124._4_4_ * fVar110 +
                                 fVar100 * auVar55._4_4_ + auVar125._4_4_ * fVar105;
                            auVar168._8_4_ =
                                 auVar124._8_4_ * fVar111 +
                                 fVar102 * auVar55._8_4_ + auVar125._8_4_ * fVar106;
                            auVar168._12_4_ =
                                 auVar124._12_4_ * fVar112 +
                                 fVar103 * auVar55._12_4_ + auVar125._12_4_ * fVar108;
                            auVar65._8_4_ = 0x80000000;
                            auVar65._0_8_ = 0x8000000080000000;
                            auVar65._12_4_ = 0x80000000;
                            auVar57 = vandps_avx(auVar168,auVar65);
                            auVar74 = ZEXT1664(auVar62);
                            uVar20 = auVar57._0_4_;
                            auVar120._0_4_ =
                                 (float)(uVar20 ^ (uint)(auVar123._0_4_ * fVar54 +
                                                        fVar53 * auVar114._0_4_ +
                                                        fVar177 * auVar135._0_4_));
                            uVar179 = auVar57._4_4_;
                            auVar120._4_4_ =
                                 (float)(uVar179 ^
                                        (uint)(auVar123._4_4_ * fVar77 +
                                              fVar76 * auVar114._4_4_ + fVar180 * auVar135._4_4_));
                            uVar181 = auVar57._8_4_;
                            auVar120._8_4_ =
                                 (float)(uVar181 ^
                                        (uint)(auVar123._8_4_ * fVar81 +
                                              fVar80 * auVar114._8_4_ + fVar182 * auVar135._8_4_));
                            uVar183 = auVar57._12_4_;
                            auVar120._12_4_ =
                                 (float)(uVar183 ^
                                        (uint)(auVar123._12_4_ * fVar97 +
                                              fVar96 * auVar114._12_4_ + fVar184 * auVar135._12_4_))
                            ;
                            auVar57 = vcmpps_avx(auVar120,_DAT_01feba10,5);
                            auVar136 = auVar62 & auVar57;
                            if ((((auVar136 >> 0x1f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0 ||
                                 (auVar136 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 ) || (auVar136 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar136[0xf] < '\0') {
                              auVar57 = vandps_avx(auVar57,auVar62);
                              auVar130._0_4_ =
                                   (float)(uVar20 ^ (uint)(auVar123._0_4_ * fVar172 +
                                                          auVar114._0_4_ * fVar52 +
                                                          fVar166 * auVar135._0_4_));
                              auVar130._4_4_ =
                                   (float)(uVar179 ^
                                          (uint)(auVar123._4_4_ * fVar174 +
                                                auVar114._4_4_ * fVar38 + fVar169 * auVar135._4_4_))
                              ;
                              auVar130._8_4_ =
                                   (float)(uVar181 ^
                                          (uint)(auVar123._8_4_ * fVar175 +
                                                auVar114._8_4_ * fVar79 + fVar170 * auVar135._8_4_))
                              ;
                              auVar130._12_4_ =
                                   (float)(uVar183 ^
                                          (uint)(auVar123._12_4_ * fVar176 +
                                                auVar114._12_4_ * fVar83 + fVar171 * auVar135._12_4_
                                                ));
                              auVar123 = vcmpps_avx(auVar130,_DAT_01feba10,5);
                              auVar114 = auVar57 & auVar123;
                              if ((((auVar114 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0 &&
                                   (auVar114 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar114 >> 0x5f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) && -1 < auVar114[0xf]) {
                                auVar74 = ZEXT1664(auVar62);
                              }
                              else {
                                auVar44._8_4_ = 0x7fffffff;
                                auVar44._0_8_ = 0x7fffffff7fffffff;
                                auVar44._12_4_ = 0x7fffffff;
                                auVar114 = vandps_avx(auVar168,auVar44);
                                auVar57 = vandps_avx(auVar123,auVar57);
                                auVar123 = vsubps_avx(auVar114,auVar120);
                                auVar123 = vcmpps_avx(auVar123,auVar130,5);
                                auVar135 = auVar57 & auVar123;
                                if ((((auVar135 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar135 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar135 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar135[0xf] < '\0') {
                                  auVar57 = vandps_avx(auVar123,auVar57);
                                  auVar145._0_4_ =
                                       (float)(uVar20 ^ (uint)(auVar124._0_4_ * fVar202 +
                                                              fVar84 * auVar55._0_4_ +
                                                              fVar75 * auVar125._0_4_));
                                  auVar145._4_4_ =
                                       (float)(uVar179 ^
                                              (uint)(auVar124._4_4_ * fVar209 +
                                                    fVar101 * auVar55._4_4_ +
                                                    fVar78 * auVar125._4_4_));
                                  auVar145._8_4_ =
                                       (float)(uVar181 ^
                                              (uint)(auVar124._8_4_ * fVar210 +
                                                    fVar107 * auVar55._8_4_ +
                                                    fVar82 * auVar125._8_4_));
                                  auVar145._12_4_ =
                                       (float)(uVar183 ^
                                              (uint)(auVar124._12_4_ * fVar211 +
                                                    fVar113 * auVar55._12_4_ +
                                                    fVar98 * auVar125._12_4_));
                                  fVar52 = auVar114._0_4_;
                                  auVar47._0_4_ = fVar52 * *(float *)(ray + 0x30);
                                  fVar53 = auVar114._4_4_;
                                  auVar47._4_4_ = fVar53 * *(float *)(ray + 0x34);
                                  fVar54 = auVar114._8_4_;
                                  auVar47._8_4_ = fVar54 * *(float *)(ray + 0x38);
                                  fVar75 = auVar114._12_4_;
                                  auVar47._12_4_ = fVar75 * *(float *)(ray + 0x3c);
                                  auVar123 = vcmpps_avx(auVar47,auVar145,1);
                                  auVar136 = *(undefined1 (*) [16])(ray + 0x80);
                                  auVar68._0_4_ = fVar52 * *(float *)(ray + 0x80);
                                  auVar68._4_4_ = fVar53 * *(float *)(ray + 0x84);
                                  auVar68._8_4_ = fVar54 * *(float *)(ray + 0x88);
                                  auVar68._12_4_ = fVar75 * *(float *)(ray + 0x8c);
                                  auVar135 = vcmpps_avx(auVar145,auVar68,2);
                                  auVar123 = vandps_avx(auVar135,auVar123);
                                  auVar135 = auVar57 & auVar123;
                                  if ((((auVar135 >> 0x1f & (undefined1  [16])0x1) !=
                                        (undefined1  [16])0x0 ||
                                       (auVar135 >> 0x3f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                      (auVar135 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar135[0xf] < '\0') {
                                    auVar57 = vandps_avx(auVar57,auVar123);
                                    auVar123 = vcmpps_avx(auVar168,_DAT_01feba10,4);
                                    auVar135 = auVar57 & auVar123;
                                    if ((((auVar135 >> 0x1f & (undefined1  [16])0x1) !=
                                          (undefined1  [16])0x0 ||
                                         (auVar135 >> 0x3f & (undefined1  [16])0x1) !=
                                         (undefined1  [16])0x0) ||
                                        (auVar135 >> 0x5f & (undefined1  [16])0x1) !=
                                        (undefined1  [16])0x0) || auVar135[0xf] < '\0') {
                                      auVar57 = vandps_avx(auVar123,auVar57);
                                      uVar179 = *(uint *)(lVar33 + 0x40 + uVar26 * 4);
                                      pGVar4 = (context->scene->geometries).items[uVar179].ptr;
                                      uVar20 = pGVar4->mask;
                                      auVar48._4_4_ = uVar20;
                                      auVar48._0_4_ = uVar20;
                                      auVar48._8_4_ = uVar20;
                                      auVar48._12_4_ = uVar20;
                                      auVar123 = vandps_avx(auVar48,*(undefined1 (*) [16])
                                                                     (ray + 0x90));
                                      auVar123 = vpcmpeqd_avx(auVar123,_DAT_01feba10);
                                      auVar135 = auVar57 & ~auVar123;
                                      if ((((auVar135 >> 0x1f & (undefined1  [16])0x1) !=
                                            (undefined1  [16])0x0 ||
                                           (auVar135 >> 0x3f & (undefined1  [16])0x1) !=
                                           (undefined1  [16])0x0) ||
                                          (auVar135 >> 0x5f & (undefined1  [16])0x1) !=
                                          (undefined1  [16])0x0) || auVar135[0xf] < '\0') {
                                        aVar161 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                                  vandnps_avx(auVar123,auVar57);
                                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                          auVar57 = vrcpps_avx(auVar114);
                                          fVar38 = auVar57._0_4_;
                                          auVar71._0_4_ = fVar52 * fVar38;
                                          fVar52 = auVar57._4_4_;
                                          auVar71._4_4_ = fVar53 * fVar52;
                                          fVar53 = auVar57._8_4_;
                                          auVar71._8_4_ = fVar54 * fVar53;
                                          fVar54 = auVar57._12_4_;
                                          auVar71._12_4_ = fVar75 * fVar54;
                                          auVar153._8_4_ = 0x3f800000;
                                          auVar153._0_8_ = &DAT_3f8000003f800000;
                                          auVar153._12_4_ = 0x3f800000;
                                          auVar57 = vsubps_avx(auVar153,auVar71);
                                          fVar38 = fVar38 + fVar38 * auVar57._0_4_;
                                          fVar52 = fVar52 + fVar52 * auVar57._4_4_;
                                          fVar53 = fVar53 + fVar53 * auVar57._8_4_;
                                          fVar54 = fVar54 + fVar54 * auVar57._12_4_;
                                          auVar72._0_4_ = fVar38 * auVar120._0_4_;
                                          auVar72._4_4_ = fVar52 * auVar120._4_4_;
                                          auVar72._8_4_ = fVar53 * auVar120._8_4_;
                                          auVar72._12_4_ = fVar54 * auVar120._12_4_;
                                          auVar57 = vminps_avx(auVar72,auVar153);
                                          auVar93._0_4_ = fVar38 * auVar130._0_4_;
                                          auVar93._4_4_ = fVar52 * auVar130._4_4_;
                                          auVar93._8_4_ = fVar53 * auVar130._8_4_;
                                          auVar93._12_4_ = fVar54 * auVar130._12_4_;
                                          auVar123 = vminps_avx(auVar93,auVar153);
                                          auVar114 = vsubps_avx(auVar153,auVar57);
                                          auVar135 = vsubps_avx(auVar153,auVar123);
                                          auVar57 = vblendvps_avx(auVar57,auVar114,auVar7);
                                          vblendvps_avx(auVar123,auVar135,auVar7);
                                          vpshufd_avx(ZEXT416(uVar179),0);
                                          vpshufd_avx(ZEXT416(*(uint *)(lVar33 + 0x50 + uVar26 * 4))
                                                      ,0);
                                          p0.field_0._0_16_ = auVar124;
                                          p0.field_0._16_16_ = auVar55;
                                          p0.field_0._32_16_ = auVar125;
                                          auVar50._0_4_ = fVar38 * auVar145._0_4_;
                                          auVar50._4_4_ = fVar52 * auVar145._4_4_;
                                          auVar50._8_4_ = fVar53 * auVar145._8_4_;
                                          auVar50._12_4_ = fVar54 * auVar145._12_4_;
                                          vcmpps_avx(ZEXT1632(auVar57),ZEXT1632(auVar57),0xf);
                                          auVar57 = vblendvps_avx(auVar136,auVar50,
                                                                  (undefined1  [16])aVar161);
                                          *(undefined1 (*) [16])(ray + 0x80) = auVar57;
                                          itime.field_0 = aVar161;
                                          p1.field_0._0_8_ = &itime;
                                          p1.field_0._8_8_ = pGVar4->userPtr;
                                          p1.field_0._16_8_ = context->user;
                                          p1.field_0._24_8_ = ray;
                                          p1.field_0._32_8_ = &p0;
                                          p1.field_0._40_4_ = 4;
                                          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                            (*pGVar4->occlusionFilterN)
                                                      ((RTCFilterFunctionNArguments *)&p1);
                                          }
                                          if (itime.field_0 ==
                                              (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0) {
                                            auVar57 = vpcmpeqd_avx((undefined1  [16])0x0,
                                                                   _DAT_01feba10);
                                            auVar57 = auVar57 ^ _DAT_01febe20;
                                          }
                                          else {
                                            p_Var6 = context->args->filter;
                                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                               (((context->args->flags &
                                                 RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                                 RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                                (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                              (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                                            }
                                            auVar124 = vpcmpeqd_avx((undefined1  [16])0x0,
                                                                    (undefined1  [16])itime.field_0)
                                            ;
                                            auVar57 = auVar124 ^ _DAT_01febe20;
                                            auVar94._8_4_ = 0xff800000;
                                            auVar94._0_8_ = 0xff800000ff800000;
                                            auVar94._12_4_ = 0xff800000;
                                            auVar124 = vblendvps_avx(auVar94,*(undefined1 (*) [16])
                                                                              (p1.field_0._24_8_ +
                                                                              0x80),auVar124);
                                            *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) =
                                                 auVar124;
                                          }
                                          auVar57 = vpslld_avx(auVar57,0x1f);
                                          aVar161 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                                    vpsrad_avx(auVar57,0x1f);
                                          auVar57 = vblendvps_avx(auVar136,*(undefined1 (*) [16])
                                                                            pRVar1,auVar57);
                                          *(undefined1 (*) [16])pRVar1 = auVar57;
                                        }
                                        auVar62 = vpandn_avx((undefined1  [16])aVar161,auVar62);
                                      }
                                    }
                                  }
                                }
                                auVar74 = ZEXT1664(auVar62);
                              }
                            }
                            auVar62 = auVar74._0_16_;
                            bVar37 = (((auVar62 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0 ||
                                      (auVar62 >> 0x3f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                     (auVar62 >> 0x5f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) || auVar74[0xf] < '\0';
                          }
                          auVar62 = auVar74._0_16_;
                          if ((!bVar37) || (bVar37 = 2 < uVar26, uVar26 = uVar26 + 1, bVar37))
                          break;
                        }
                        auVar57 = vandps_avx(auVar62,auVar129);
                        auVar129 = auVar129 & auVar62;
                      } while (((((auVar129 >> 0x1f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0 ||
                                 (auVar129 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 ) || (auVar129 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar129[0xf] < '\0') &&
                              (uVar22 = uVar22 + 1, auVar129 = auVar57, uVar22 < uVar27 - 8));
                      auVar62 = vpcmpeqd_avx(auVar62,auVar62);
                      aVar51._0_4_ = auVar57._0_4_ ^ auVar62._0_4_;
                      aVar51._4_4_ = auVar57._4_4_ ^ auVar62._4_4_;
                      aVar51._8_4_ = auVar57._8_4_ ^ auVar62._8_4_;
                      aVar51._12_4_ = auVar57._12_4_ ^ auVar62._12_4_;
                    }
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         vorps_avx((undefined1  [16])aVar51,(undefined1  [16])terminated.field_0);
                    auVar62 = auVar62 & ~(undefined1  [16])terminated.field_0;
                    if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar62 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar62 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar62[0xf]) goto LAB_00329344;
                    auVar95._8_4_ = 0xff800000;
                    auVar95._0_8_ = 0xff800000ff800000;
                    auVar95._12_4_ = 0xff800000;
                    tray.tfar.field_0 =
                         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar95,
                                       (undefined1  [16])terminated.field_0);
                    iVar21 = 0;
                    break;
                  }
                  goto LAB_00329355;
                }
                uVar22 = root.ptr & 0xfffffffffffffff0;
                auVar62 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar62,6);
                auVar74 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                uVar27 = 0;
                sVar35 = 8;
                do {
                  sVar3 = *(size_t *)(uVar22 + uVar27 * 8);
                  root.ptr = sVar35;
                  if (sVar3 != 8) {
                    aVar56 = auVar74._0_16_;
                    fVar52 = *(float *)(uVar22 + 0x80 + uVar27 * 4);
                    fVar53 = *(float *)(uVar22 + 0x20 + uVar27 * 4);
                    auVar57 = *(undefined1 (*) [16])(ray + 0x70);
                    fVar54 = auVar57._0_4_;
                    fVar75 = auVar57._4_4_;
                    fVar38 = auVar57._8_4_;
                    fVar76 = auVar57._12_4_;
                    auVar85._0_4_ = fVar54 * fVar52 + fVar53;
                    auVar85._4_4_ = fVar75 * fVar52 + fVar53;
                    auVar85._8_4_ = fVar38 * fVar52 + fVar53;
                    auVar85._12_4_ = fVar76 * fVar52 + fVar53;
                    fVar52 = *(float *)(uVar22 + 0xa0 + uVar27 * 4);
                    fVar53 = *(float *)(uVar22 + 0x40 + uVar27 * 4);
                    auVar115._0_4_ = fVar54 * fVar52 + fVar53;
                    auVar115._4_4_ = fVar75 * fVar52 + fVar53;
                    auVar115._8_4_ = fVar38 * fVar52 + fVar53;
                    auVar115._12_4_ = fVar76 * fVar52 + fVar53;
                    fVar52 = *(float *)(uVar22 + 0xc0 + uVar27 * 4);
                    fVar53 = *(float *)(uVar22 + 0x60 + uVar27 * 4);
                    auVar126._0_4_ = fVar54 * fVar52 + fVar53;
                    auVar126._4_4_ = fVar75 * fVar52 + fVar53;
                    auVar126._8_4_ = fVar38 * fVar52 + fVar53;
                    auVar126._12_4_ = fVar76 * fVar52 + fVar53;
                    fVar52 = *(float *)(uVar22 + 0x90 + uVar27 * 4);
                    fVar53 = *(float *)(uVar22 + 0x30 + uVar27 * 4);
                    auVar137._0_4_ = fVar54 * fVar52 + fVar53;
                    auVar137._4_4_ = fVar75 * fVar52 + fVar53;
                    auVar137._8_4_ = fVar38 * fVar52 + fVar53;
                    auVar137._12_4_ = fVar76 * fVar52 + fVar53;
                    fVar52 = *(float *)(uVar22 + 0xb0 + uVar27 * 4);
                    fVar53 = *(float *)(uVar22 + 0x50 + uVar27 * 4);
                    auVar150._0_4_ = fVar54 * fVar52 + fVar53;
                    auVar150._4_4_ = fVar75 * fVar52 + fVar53;
                    auVar150._8_4_ = fVar38 * fVar52 + fVar53;
                    auVar150._12_4_ = fVar76 * fVar52 + fVar53;
                    fVar52 = *(float *)(uVar22 + 0xd0 + uVar27 * 4);
                    fVar53 = *(float *)(uVar22 + 0x70 + uVar27 * 4);
                    auVar160._0_4_ = fVar53 + fVar54 * fVar52;
                    auVar160._4_4_ = fVar53 + fVar75 * fVar52;
                    auVar160._8_4_ = fVar53 + fVar38 * fVar52;
                    auVar160._12_4_ = fVar53 + fVar76 * fVar52;
                    auVar14._8_8_ = tray.org.field_0._8_8_;
                    auVar14._0_8_ = tray.org.field_0._0_8_;
                    auVar15._8_8_ = tray.org.field_0._24_8_;
                    auVar15._0_8_ = tray.org.field_0._16_8_;
                    auVar16._8_8_ = tray.org.field_0._40_8_;
                    auVar16._0_8_ = tray.org.field_0._32_8_;
                    auVar124 = vsubps_avx(auVar85,auVar14);
                    auVar186._0_4_ = tray.rdir.field_0._0_4_ * auVar124._0_4_;
                    auVar186._4_4_ = tray.rdir.field_0._4_4_ * auVar124._4_4_;
                    auVar186._8_4_ = tray.rdir.field_0._8_4_ * auVar124._8_4_;
                    auVar186._12_4_ = tray.rdir.field_0._12_4_ * auVar124._12_4_;
                    auVar124 = vsubps_avx(auVar115,auVar15);
                    auVar193._0_4_ = auVar124._0_4_ * (float)tray.rdir.field_0._16_4_;
                    auVar193._4_4_ = auVar124._4_4_ * (float)tray.rdir.field_0._20_4_;
                    auVar193._8_4_ = auVar124._8_4_ * (float)tray.rdir.field_0._24_4_;
                    auVar193._12_4_ = auVar124._12_4_ * (float)tray.rdir.field_0._28_4_;
                    auVar124 = vsubps_avx(auVar126,auVar16);
                    auVar203._0_4_ = auVar124._0_4_ * (float)tray.rdir.field_0._32_4_;
                    auVar203._4_4_ = auVar124._4_4_ * (float)tray.rdir.field_0._36_4_;
                    auVar203._8_4_ = auVar124._8_4_ * (float)tray.rdir.field_0._40_4_;
                    auVar203._12_4_ = auVar124._12_4_ * (float)tray.rdir.field_0._44_4_;
                    auVar124 = vsubps_avx(auVar137,auVar14);
                    auVar138._0_4_ = tray.rdir.field_0._0_4_ * auVar124._0_4_;
                    auVar138._4_4_ = tray.rdir.field_0._4_4_ * auVar124._4_4_;
                    auVar138._8_4_ = tray.rdir.field_0._8_4_ * auVar124._8_4_;
                    auVar138._12_4_ = tray.rdir.field_0._12_4_ * auVar124._12_4_;
                    auVar124 = vsubps_avx(auVar150,auVar15);
                    auVar116._0_4_ = auVar124._0_4_ * (float)tray.rdir.field_0._16_4_;
                    auVar116._4_4_ = auVar124._4_4_ * (float)tray.rdir.field_0._20_4_;
                    auVar116._8_4_ = auVar124._8_4_ * (float)tray.rdir.field_0._24_4_;
                    auVar116._12_4_ = auVar124._12_4_ * (float)tray.rdir.field_0._28_4_;
                    auVar124 = vsubps_avx(auVar160,auVar16);
                    auVar127._0_4_ = auVar124._0_4_ * (float)tray.rdir.field_0._32_4_;
                    auVar127._4_4_ = auVar124._4_4_ * (float)tray.rdir.field_0._36_4_;
                    auVar127._8_4_ = auVar124._8_4_ * (float)tray.rdir.field_0._40_4_;
                    auVar127._12_4_ = auVar124._12_4_ * (float)tray.rdir.field_0._44_4_;
                    auVar124 = vpminsd_avx(auVar186,auVar138);
                    auVar55 = vpminsd_avx(auVar193,auVar116);
                    auVar124 = vpmaxsd_avx(auVar124,auVar55);
                    auVar55 = vpminsd_avx(auVar203,auVar127);
                    auVar124 = vpmaxsd_avx(auVar124,auVar55);
                    auVar55 = vpmaxsd_avx(auVar186,auVar138);
                    auVar125 = vpmaxsd_avx(auVar193,auVar116);
                    auVar123 = vpminsd_avx(auVar55,auVar125);
                    auVar55 = vpmaxsd_avx(auVar203,auVar127);
                    auVar125 = vpmaxsd_avx(auVar124,(undefined1  [16])tray.tnear.field_0);
                    auVar55 = vpminsd_avx(auVar123,auVar55);
                    auVar55 = vpminsd_avx(auVar55,(undefined1  [16])tray.tfar.field_0);
                    if ((uVar20 & 7) == 6) {
                      auVar55 = vcmpps_avx(auVar125,auVar55,2);
                      uVar24 = *(undefined4 *)(uVar22 + 0xe0 + uVar27 * 4);
                      auVar128._4_4_ = uVar24;
                      auVar128._0_4_ = uVar24;
                      auVar128._8_4_ = uVar24;
                      auVar128._12_4_ = uVar24;
                      auVar125 = vcmpps_avx(auVar128,auVar57,2);
                      uVar24 = *(undefined4 *)(uVar22 + 0xf0 + uVar27 * 4);
                      auVar139._4_4_ = uVar24;
                      auVar139._0_4_ = uVar24;
                      auVar139._8_4_ = uVar24;
                      auVar139._12_4_ = uVar24;
                      auVar57 = vcmpps_avx(auVar57,auVar139,1);
                      auVar57 = vandps_avx(auVar125,auVar57);
                      auVar57 = vandps_avx(auVar57,auVar55);
                    }
                    else {
                      auVar57 = vcmpps_avx(auVar125,auVar55,2);
                    }
                    auVar57 = vandps_avx(auVar57,auVar62);
                    auVar57 = vpslld_avx(auVar57,0x1f);
                    if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar57 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar57 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar57[0xf]) {
                      auVar74 = ZEXT1664((undefined1  [16])aVar56);
                    }
                    else {
                      auVar117._8_4_ = 0x7f800000;
                      auVar117._0_8_ = 0x7f8000007f800000;
                      auVar117._12_4_ = 0x7f800000;
                      auVar57 = vblendvps_avx(auVar117,auVar124,auVar57);
                      auVar74 = ZEXT1664(auVar57);
                      root.ptr = sVar3;
                      if (sVar35 != 8) {
                        pNVar36->ptr = sVar35;
                        pNVar36 = pNVar36 + 1;
                        *paVar34 = aVar56;
                        paVar34 = paVar34 + 1;
                      }
                    }
                  }
                } while ((sVar3 != 8) &&
                        (bVar37 = uVar27 < 3, uVar27 = uVar27 + 1, sVar35 = root.ptr, bVar37));
                iVar21 = 0;
                if (root.ptr == 8) {
LAB_003281f4:
                  bVar37 = false;
                  iVar21 = 4;
                }
                else {
                  auVar62 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                       (undefined1  [16])auVar74._0_16_,6);
                  uVar24 = vmovmskps_avx(auVar62);
                  bVar37 = true;
                  if ((uint)POPCOUNT(uVar24) <= uVar28) {
                    pNVar36->ptr = root.ptr;
                    pNVar36 = pNVar36 + 1;
                    *paVar34 = auVar74._0_16_;
                    paVar34 = paVar34 + 1;
                    goto LAB_003281f4;
                  }
                }
              } while (bVar37);
            }
          }
        }
      } while (iVar21 != 3);
      auVar7 = vandps_avx(auVar73,(undefined1  [16])terminated.field_0);
      auVar73._8_4_ = 0xff800000;
      auVar73._0_8_ = 0xff800000ff800000;
      auVar73._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar73);
      *(undefined1 (*) [16])pRVar1 = auVar7;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }